

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::ReadMatchDistances(CLzmaEnc *p,UInt32 *numDistancePairsRes)

{
  UInt32 UVar1;
  Byte *pBVar2;
  bool bVar3;
  Byte *pby2;
  UInt32 numAvail;
  UInt32 distance;
  Byte *pby;
  UInt32 numPairs;
  UInt32 lenRes;
  UInt32 *numDistancePairsRes_local;
  CLzmaEnc *p_local;
  
  pby._4_4_ = 0;
  UVar1 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  p->numAvail = UVar1;
  UVar1 = (*(p->matchFinder).GetMatches)(p->matchFinderObj,p->matches);
  if ((UVar1 != 0) && (pby._4_4_ = p->matches[UVar1 - 2], pby._4_4_ == p->numFastBytes)) {
    pBVar2 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
    pby2._0_4_ = p->numAvail;
    if (0x111 < (uint)pby2) {
      pby2._0_4_ = 0x111;
    }
    while( true ) {
      bVar3 = false;
      if (pby._4_4_ < (uint)pby2) {
        bVar3 = pBVar2[(ulong)pby._4_4_ - 1] ==
                pBVar2[(ulong)pby._4_4_ + (-1 - (ulong)(p->matches[UVar1 - 1] + 1))];
      }
      if (!bVar3) break;
      pby._4_4_ = pby._4_4_ + 1;
    }
  }
  p->additionalOffset = p->additionalOffset + 1;
  *numDistancePairsRes = UVar1;
  return pby._4_4_;
}

Assistant:

static UInt32 ReadMatchDistances(CLzmaEnc* p, UInt32* numDistancePairsRes) {
  UInt32 lenRes = 0, numPairs;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  numPairs = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
#ifdef SHOW_STAT
  printf("\n i = %d numPairs = %d    ", ttt, numPairs / 2);
  ttt++;
  {
    UInt32 i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2d %6d   | ", p->matches[i], p->matches[i + 1]);
  }
#endif
  if (numPairs > 0) {
    lenRes = p->matches[numPairs - 2];
    if (lenRes == p->numFastBytes) {
      const Byte* pby = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
      UInt32 distance = p->matches[numPairs - 1] + 1;
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte* pby2 = pby - distance;
        for (; lenRes < numAvail && pby[lenRes] == pby2[lenRes]; lenRes++)
          ;
      }
    }
  }
  p->additionalOffset++;
  *numDistancePairsRes = numPairs;
  return lenRes;
}